

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
__thiscall V4L2Device::decompress_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  bool bVar1;
  int iVar2;
  bool *pbVar3;
  reference pvVar4;
  pointer pRVar5;
  undefined4 *in_RDX;
  undefined8 extraout_RDX;
  _Tuple_impl<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  in_RDI;
  tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  tVar6;
  uchar *buffer_array [1];
  JDIMENSION raw_size;
  JDIMENSION row_stride;
  int pixel_size;
  JDIMENSION height;
  JDIMENSION width;
  int rc;
  __u32 idx;
  bool quiet;
  JPEGErrorManager jerr;
  RawImagePtr image;
  jpeg_decompress_struct cinfo;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 uVar7;
  undefined2 in_stack_fffffffffffff9dc;
  DispatchAction in_stack_fffffffffffff9de;
  Writer *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  uint uVar8;
  undefined4 in_stack_fffffffffffff9ec;
  uint uVar9;
  char *in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  Level level;
  Writer *in_stack_fffffffffffffa00;
  string *in_stack_fffffffffffffa08;
  VerboseLevel in_stack_fffffffffffffa10;
  undefined2 in_stack_fffffffffffffa12;
  undefined4 in_stack_fffffffffffffa14;
  pointer local_588 [3];
  uint local_570;
  int local_56c;
  int local_568;
  uint local_564;
  uint local_560;
  undefined1 local_559;
  Writer local_558;
  int local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined1 local_4d9;
  allocator local_461;
  string local_460 [35];
  byte local_43d;
  code *local_430 [2];
  code *local_420;
  __jmp_buf_tag _Stack_378;
  undefined8 local_2a8 [17];
  uint local_220;
  uint local_21c;
  int local_214;
  uint local_200;
  undefined4 *local_18;
  
  level = (Level)((ulong)in_stack_fffffffffffff9f8 >> 0x30);
  local_18 = in_RDX;
  std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>::
  unique_ptr<std::default_delete<V4L2Device::RawImage>,void>
            ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
             in_stack_fffffffffffff9e0);
  JPEGErrorManager::JPEGErrorManager((JPEGErrorManager *)0x1eac6e);
  std::shared_ptr<cxxopts::Options>::operator=
            ((shared_ptr<cxxopts::Options> *)in_stack_fffffffffffff9e0,
             (shared_ptr<cxxopts::Options> *)
             CONCAT26(in_stack_fffffffffffff9de,
                      CONCAT24(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)));
  local_2a8[0] = jpeg_std_error(local_430);
  local_430[0] = jpeg_error_exit_cb;
  local_420 = jpeg_output_message_cb;
  iVar2 = _setjmp(&_Stack_378);
  if (iVar2 == 0) {
    jpeg_CreateDecompress(local_2a8,0x50,0x290);
    local_4e4 = *local_18;
    pvVar4 = std::array<V4L2Device::IOBuffer,_32UL>::operator[]
                       ((array<V4L2Device::IOBuffer,_32UL> *)in_stack_fffffffffffff9e0,
                        CONCAT26(in_stack_fffffffffffff9de,
                                 CONCAT24(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)));
    jpeg_mem_src(local_2a8,pvVar4->start,local_18[0x12]);
    local_4e8 = jpeg_read_header(local_2a8,1);
    if (local_4e8 == 1) {
      jpeg_start_decompress(local_2a8);
      local_560 = local_220;
      local_564 = local_21c;
      local_568 = local_214;
      local_56c = local_220 * local_214;
      local_570 = local_220 * local_21c * local_214;
      operator_new(0x10);
      RawImage::RawImage((RawImage *)in_stack_fffffffffffff9e0);
      std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>::
      unique_ptr<std::default_delete<V4L2Device::RawImage>,void>
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9e0,
                 (pointer)CONCAT26(in_stack_fffffffffffff9de,
                                   CONCAT24(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)));
      std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::operator=
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9e0,
                 (unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 CONCAT26(in_stack_fffffffffffff9de,
                          CONCAT24(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)));
      std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::~unique_ptr
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9e0);
      operator_new__((ulong)local_570);
      std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
      unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_fffffffffffff9e0,
                 (uchar *)CONCAT26(in_stack_fffffffffffff9de,
                                   CONCAT24(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)));
      std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::operator->
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 0x1eb13f);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_fffffffffffff9e0,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT26(in_stack_fffffffffffff9de,
                          CONCAT24(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)));
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_fffffffffffff9e0);
      uVar8 = local_560;
      pRVar5 = std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::
               operator->((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                           *)0x1eb174);
      pRVar5->width = uVar8;
      uVar9 = local_564;
      pRVar5 = std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::
               operator->((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                           *)0x1eb193);
      pRVar5->height = uVar9;
      while (local_200 < local_21c) {
        std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::
        operator->((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                   0x1eb1b7);
        local_588[0] = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                 ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                   *)in_stack_fffffffffffff9e0);
        local_588[0] = local_588[0] + local_200 * local_56c;
        jpeg_read_scanlines(local_2a8,local_588,1);
      }
      jpeg_finish_decompress(local_2a8);
      jpeg_destroy_decompress(local_2a8);
      std::
      make_tuple<bool,std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>>
                ((bool *)CONCAT44(uVar9,uVar8),
                 (unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9e0);
    }
    else {
      uVar7 = 0;
      el::base::Writer::Writer
                (in_stack_fffffffffffffa00,level,in_stack_fffffffffffff9f0,
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (char *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9de,
                 in_stack_fffffffffffffa10);
      el::base::Writer::construct(&local_558,1,el::base::consts::kDefaultLoggerId);
      el::base::Writer::operator<<
                (in_stack_fffffffffffff9e0,
                 (char (*) [12])
                 CONCAT26(in_stack_fffffffffffff9de,CONCAT24(in_stack_fffffffffffff9dc,uVar7)));
      el::base::Writer::~Writer(in_stack_fffffffffffff9e0);
      local_559 = 0;
      std::
      make_tuple<bool,std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>>
                ((bool *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9e0);
    }
  }
  else {
    std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff9e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"quiet",&local_461);
    cxxopts::Options::operator[]
              ((Options *)
               CONCAT44(in_stack_fffffffffffffa14,
                        CONCAT22(in_stack_fffffffffffffa12,in_stack_fffffffffffffa10)),
               in_stack_fffffffffffffa08);
    pbVar3 = cxxopts::OptionDetails::as<bool>((OptionDetails *)in_stack_fffffffffffff9e0);
    bVar1 = *pbVar3;
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    local_43d = bVar1 & 1;
    if (local_43d == 0) {
      uVar7 = 0;
      el::base::Writer::Writer
                (in_stack_fffffffffffffa00,level,in_stack_fffffffffffff9f0,
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (char *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9de,
                 in_stack_fffffffffffffa10);
      el::base::Writer::construct
                ((Writer *)&stack0xfffffffffffffb28,1,el::base::consts::kDefaultLoggerId);
      el::base::Writer::operator<<
                (in_stack_fffffffffffff9e0,
                 (char (*) [200])
                 CONCAT26(in_stack_fffffffffffff9de,CONCAT24(in_stack_fffffffffffff9dc,uVar7)));
      el::base::Writer::~Writer(in_stack_fffffffffffff9e0);
    }
    jpeg_destroy_decompress(local_2a8);
    local_4d9 = 0;
    std::
    make_tuple<bool,std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>>
              ((bool *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
               in_stack_fffffffffffff9e0);
  }
  local_4e0 = 1;
  JPEGErrorManager::~JPEGErrorManager((JPEGErrorManager *)0x1eb253);
  std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::~unique_ptr
            ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
             in_stack_fffffffffffff9e0);
  tVar6.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ._8_8_ = extraout_RDX;
  tVar6.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>._M_t.
  super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
  super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
       in_RDI.
       super__Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
       ._M_head_impl._M_t.
       super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>._M_t.
       super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
       super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl;
  return (tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
          )tVar6.
           super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ;
}

Assistant:

std::tuple<bool, RawImagePtr>
    decompress_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        struct jpeg_decompress_struct cinfo;
        RawImagePtr image;

        JPEGErrorManager jerr;
        jerr.options = options;
        cinfo.err = jpeg_std_error(&jerr.pub);
        jerr.pub.error_exit = jpeg_error_exit_cb;
        jerr.pub.output_message = jpeg_output_message_cb;

        if (setjmp(jerr.setjmp_buffer)) {
            // If we get here, the JPEG code has signaled an error.
            auto quiet = (*options)["quiet"].as<bool>();
            if (not quiet) {
                LOG(WARNING) << jpeg_last_error_msg;
            }

            jpeg_destroy_decompress(&cinfo);

            return std::make_tuple(false, std::move(image));
        }

        jpeg_create_decompress(&cinfo);

        auto idx = bufferinfo.index;
        jpeg_mem_src(&cinfo, static_cast<unsigned char*>(buffers[idx].start), bufferinfo.length);

        auto rc = jpeg_read_header(&cinfo, TRUE);
        if (rc != 1) {
            LOG(ERROR) << "broken JPEG";
            return std::make_tuple(false, std::move(image));
        }

        jpeg_start_decompress(&cinfo);

        auto width = cinfo.output_width;
        auto height = cinfo.output_height;
        auto pixel_size = cinfo.output_components;
        auto row_stride = width * pixel_size;
        auto raw_size = width * height * pixel_size;

        image = RawImagePtr(new RawImage);

        image->raw_data = MemBufferPtr(new unsigned char[raw_size]);
        image->width = width;
        image->height = height;

        while (cinfo.output_scanline < cinfo.output_height) {
            unsigned char* buffer_array[1];
            buffer_array[0] = image->raw_data.get() + (cinfo.output_scanline) * row_stride;
            jpeg_read_scanlines(&cinfo, buffer_array, 1);
        }

        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);

        return std::make_tuple(true, std::move(image));
    }